

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

double dd_ev(long ndims,Integer *ardims,Integer *pedims)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  if (0 < ndims) {
    dVar3 = 1.0;
    lVar2 = 0;
    do {
      lVar1 = ardims[lVar2];
      dVar3 = dVar3 * ((double)(lVar1 - lVar1 % pedims[lVar2]) / (double)lVar1);
      lVar2 = lVar2 + 1;
    } while (ndims != lVar2);
    return dVar3;
  }
  return 1.0;
}

Assistant:

double dd_ev(long ndims,Integer ardims[], Integer pedims[])
      {
      double q, t;
      long k;
      q = 1.0;
      t = 1.0;
      for(k=0;k<ndims;k++){
          q = (ardims[k]/pedims[k])*pedims[k];
          t = t*(q/(double)ardims[k]);
      }
      return t;
      }